

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O1

void __thiscall
poplar::compact_vector::compact_vector
          (compact_vector *this,uint64_t size,uint32_t width,uint64_t init)

{
  uint64_t i;
  
  compact_vector(this,size,width);
  if (size != 0) {
    i = 0;
    do {
      set(this,i,init);
      i = i + 1;
    } while (size != i);
  }
  return;
}

Assistant:

compact_vector(uint64_t size, uint32_t width, uint64_t init) : compact_vector{size, width} {
        for (uint64_t i = 0; i < size; ++i) {
            set(i, init);
        }
    }